

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoApproveIfMissingReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::AutoApproveIfMissingReporter::report
          (AutoApproveIfMissingReporter *this,string *received,string *approved)

{
  pointer pcVar1;
  bool bVar2;
  AutoApproveReporter local_60;
  string local_58;
  string local_38;
  
  bVar2 = FileUtils::fileExists(approved);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    local_60.super_Reporter._vptr_Reporter = (Reporter)&PTR__Reporter_001a58f8;
    pcVar1 = (received->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + received->_M_string_length);
    pcVar1 = (approved->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + approved->_M_string_length);
    bVar2 = AutoApproveReporter::report(&local_60,&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return bVar2;
}

Assistant:

bool AutoApproveIfMissingReporter::report(std::string received,
                                              std::string approved) const
    {
        if (FileUtils::fileExists(approved))
        {
            return false;
        }

        return AutoApproveReporter().report(received, approved);
    }